

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int input_stats_lap(TWO_PASS *p,TWO_PASS_FRAME *p_frame,FIRSTPASS_STATS *fps)

{
  void *in_RDX;
  ulong *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (*in_RSI < *(ulong *)(*(long *)(in_RDI + 0x198) + 8)) {
    memcpy(in_RDX,(void *)*in_RSI,0xe8);
    memmove(*(void **)(in_RDI + 8),*(void **)(in_RDI + 0x10),
            ((long)(*(long *)(*(long *)(in_RDI + 0x198) + 8) - *in_RSI) / 0xe8 + -1) * 0xe8);
    *(long *)(*(long *)(in_RDI + 0x198) + 8) = *(long *)(*(long *)(in_RDI + 0x198) + 8) + -0xe8;
    local_4 = 1;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int input_stats_lap(TWO_PASS *p, TWO_PASS_FRAME *p_frame,
                           FIRSTPASS_STATS *fps) {
  if (p_frame->stats_in >= p->stats_buf_ctx->stats_in_end) return EOF;

  *fps = *p_frame->stats_in;
  /* Move old stats[0] out to accommodate for next frame stats  */
  memmove(p->frame_stats_arr[0], p->frame_stats_arr[1],
          (p->stats_buf_ctx->stats_in_end - p_frame->stats_in - 1) *
              sizeof(FIRSTPASS_STATS));
  p->stats_buf_ctx->stats_in_end--;
  return 1;
}